

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O2

void __thiscall
phmap::priv::anon_unknown_0::Btree_map_int32_Test::TestBody(Btree_map_int32_Test *this)

{
  btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_> *pbVar1;
  PropagatingCountingAlloc<phmap::btree_map<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>_>_>
  PVar2;
  PropagatingCountingAlloc<phmap::btree_map<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>_>_>
  PVar3;
  byte bVar4;
  bool bVar5;
  pointer p;
  pointer p_00;
  _Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
  this_00;
  slot_type *psVar6;
  btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
  *pbVar7;
  value_type vVar8;
  pair<const_int,_int> pVar9;
  mapped_type *pmVar10;
  template_ElementType<2UL> *ptVar11;
  pointer ppVar12;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *values;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *values_00;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *values_01;
  const_pointer hint;
  const_pointer hint_00;
  undefined8 extraout_RDX;
  size_type n;
  size_type n_00;
  int i_3;
  uint uVar13;
  btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
  *pbVar14;
  int i;
  int iVar15;
  unique_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  *b;
  size_type i_00;
  int in_R8D;
  char *pcVar16;
  pair<int,_int> pVar17;
  uint uVar18;
  undefined1 *this_01;
  const_iterator cVar19;
  iterator iVar20;
  iterator iVar21;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
  iter;
  iterator iter_00;
  value_type local_110;
  AssertHelper local_108;
  int64_t bytes1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> sorted_values;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> random_values;
  int64_t original_bytes1;
  int64_t bytes2;
  Generator<std::pair<const_int,_int>_> generator;
  unique_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  container;
  PropagatingCountingAlloc<phmap::btree_map<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>_>_>
  allocator2;
  PropagatingCountingAlloc<phmap::btree_map<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>_>_>
  allocator1;
  
  (anonymous_namespace)::
  ConstTest<phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>>();
  GenerateValuesWithSeed<std::pair<int,int>>
            (&random_values,(priv *)0x2710,40000,testing::FLAGS_gtest_random_seed,in_R8D);
  container.
  super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  .const_tree_ = (btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                  *)&container;
  container.
  super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  .tree_.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .tree_.root_.
  super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
        )btree<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
         ::EmptyNode()::empty_node;
  container.
  super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  .tree_.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .tree_.rightmost_ =
       (node_type *)
       btree<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
       ::EmptyNode()::empty_node;
  container.
  super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  .tree_.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .tree_.size_ = 0;
  container.
  super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  .checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &container.
        super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
        .checker_._M_t._M_impl.super__Rb_tree_header._M_header;
  container.
  super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  .checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  container.
  super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  .checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  container.
  super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  .checker_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  container.
  super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  .checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       container.
       super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
       .checker_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            (&sorted_values,&random_values);
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (sorted_values.
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start,
             CONCAT44(sorted_values.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                      (int)sorted_values.
                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish));
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::unique_checker<phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>,std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>,std::pair<int,int>>
            ((char *)&container,
             (unique_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
              *)&sorted_values,values);
  std::
  __reverse<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
            (sorted_values.
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start,
             CONCAT44(sorted_values.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                      (int)sorted_values.
                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish));
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::unique_checker<phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>,std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>,std::pair<int,int>>
            ((char *)&container,
             (unique_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
              *)&sorted_values,values_00);
  b = (unique_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
       *)&random_values;
  (anonymous_namespace)::
  DoTest<phmap::priv::(anonymous_namespace)::unique_checker<phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>,std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>,std::pair<int,int>>
            ((char *)&container,b,values_01);
  std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
            (&sorted_values.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
  base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  ::~base_checker(&container.
                   super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
                 );
  std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
            (&random_values.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
  bytes1 = 0;
  bytes2 = 0;
  generator.tgen.maxval = 1000;
  generator.ugen.maxval = 1000;
  allocator2.
  super_CountingAllocator<phmap::btree_map<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>_>_>
  .bytes_used_ = (CountingAllocator<phmap::btree_map<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>_>_>
                  )(CountingAllocator<phmap::btree_map<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>_>_>
                    )&bytes2;
  allocator1.
  super_CountingAllocator<phmap::btree_map<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>_>_>
  .bytes_used_ = (CountingAllocator<phmap::btree_map<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>_>_>
                  )(CountingAllocator<phmap::btree_map<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>_>_>
                    )&bytes1;
  p = CountingAllocator<phmap::btree_map<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>_>_>
      ::allocate(&allocator1.
                  super_CountingAllocator<phmap::btree_map<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>_>_>
                 ,(size_type)b,hint);
  p_00 = CountingAllocator<phmap::btree_map<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>_>_>
         ::allocate(&allocator2.
                     super_CountingAllocator<phmap::btree_map<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>_>_>
                    ,(size_type)b,hint_00);
  this_01 = btree<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
            ::EmptyNode()::empty_node;
  container.
  super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  .tree_.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .tree_.root_.
  super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
        )btree<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
         ::EmptyNode()::empty_node;
  container.
  super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  .tree_.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .tree_.size_ = (size_type)
                 btree<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
                 ::EmptyNode()::empty_node;
  container.
  super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  .const_tree_ = (btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                  *)0x0;
  random_values.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)btree<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
                ::EmptyNode()::empty_node;
  random_values.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)btree<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
                ::EmptyNode()::empty_node;
  original_bytes1 = bytes1;
  random_values.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)&bytes2;
  container.
  super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  .tree_.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .tree_.rightmost_ = (node_type *)&bytes1;
  local_110 = Generator<std::pair<const_int,_int>_>::operator()(&generator,0);
  btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>_>
  ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_bool>
            *)&sorted_values,
           (btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>_>
            *)&container,&local_110);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)&sorted_values,"bytes1","original_bytes1",&bytes1,&original_bytes1);
  if ((char)sorted_values.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&local_110);
    if ((undefined8 *)
        CONCAT44(sorted_values.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish._4_4_,
                 (int)sorted_values.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) == (undefined8 *)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)CONCAT44(sorted_values.
                                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)sorted_values.
                                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2be,pcVar16);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_110 != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&sorted_values.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish);
  btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
  ::clear((btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
           *)&container);
  container.
  super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  .tree_.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .tree_.rightmost_ = (node_type *)&bytes2;
  if (container.
      super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
      .const_tree_ !=
      (btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x0) {
    __assert_fail("empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x9a5,
                  "void phmap::priv::btree<phmap::priv::map_params<int, int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const int, int>>, 256, false>>::copy_or_move_values_in_order(Btree *) [Params = phmap::priv::map_params<int, int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const int, int>>, 256, false>, Btree = const phmap::priv::btree<phmap::priv::map_params<int, int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const int, int>>, 256, false>>]"
                 );
  }
  cVar19 = btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
           ::end((btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                  *)&random_values);
  if (cVar19.node !=
      (btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
       *)btree<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
         ::EmptyNode()::empty_node || cVar19.position != 0) {
    this_00._M_head_impl =
         (btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
          *)btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
            ::new_leaf_root_node
                      ((btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                        *)&container,1);
    container.
    super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
    .tree_.
    super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
    .
    super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
    .
    super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
    .tree_.root_.
    super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
    .
    super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
    .
    super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
    .
    super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
    ._M_head_impl =
         (_Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
          )(_Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
            )this_00._M_head_impl;
    container.
    super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
    .tree_.
    super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
    .
    super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
    .
    super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
    .tree_.size_ = (size_type)this_00._M_head_impl;
    do {
      bVar4 = btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
              ::count((btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                       *)this_00._M_head_impl);
      pbVar7 = (btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                *)(ulong)bVar4;
      for (pbVar14 = (btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                      *)0x0; pbVar7 != pbVar14; pbVar14 = pbVar14 + 1) {
        psVar6 = btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                 ::slot((btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                         *)this_00._M_head_impl,(size_type)pbVar14);
        if (0 < (psVar6->value).first) {
          pbVar7 = (btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                    *)((ulong)pbVar14 & 0xffffffff);
          break;
        }
      }
      bVar5 = btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
              ::leaf((btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                      *)this_00._M_head_impl);
      if (bVar5) goto LAB_00130159;
      this_00._M_head_impl =
           (btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
            *)btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
              ::child(this_00._M_head_impl,(long)(int)pbVar7);
    } while( true );
  }
  vVar8.first = 0;
  vVar8.second = 0;
LAB_001302d0:
  local_108.data_._0_4_ = 0;
  local_110 = vVar8;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&sorted_values,"b1.size()","0",(unsigned_long *)&local_110,
             (int *)&local_108);
  if ((char)sorted_values.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&local_110);
    if ((undefined8 *)
        CONCAT44(sorted_values.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish._4_4_,
                 (int)sorted_values.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) == (undefined8 *)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)CONCAT44(sorted_values.
                                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)sorted_values.
                                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2c2,pcVar16);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_110 != (value_type)0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&sorted_values.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish);
  local_110.first = 0;
  local_110.second = 0;
  local_108.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&sorted_values,"b2.size()","0",(unsigned_long *)&local_110,
             (int *)&local_108);
  if ((char)sorted_values.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&local_110);
    if ((undefined8 *)
        CONCAT44(sorted_values.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish._4_4_,
                 (int)sorted_values.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) == (undefined8 *)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)CONCAT44(sorted_values.
                                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)sorted_values.
                                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2c3,pcVar16);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_110 != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&sorted_values.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&sorted_values,"bytes1","original_bytes1",&bytes1,&original_bytes1);
  if ((char)sorted_values.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&local_110);
    if ((undefined8 *)
        CONCAT44(sorted_values.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish._4_4_,
                 (int)sorted_values.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) == (undefined8 *)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)CONCAT44(sorted_values.
                                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)sorted_values.
                                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2c4,pcVar16);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_110 != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&sorted_values.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish);
  for (iVar15 = 1; iVar15 != 1000; iVar15 = iVar15 + 1) {
    local_110 = Generator<std::pair<const_int,_int>_>::operator()(&generator,iVar15);
    btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>_>
    ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_bool>
              *)&sorted_values,
             (btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>_>
              *)&container,&local_110);
  }
  testing::internal::CmpHelperGT<long,long>
            ((internal *)&sorted_values,"bytes2","bytes1",&bytes2,&bytes1);
  if ((char)sorted_values.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&local_110);
    if ((undefined8 *)
        CONCAT44(sorted_values.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish._4_4_,
                 (int)sorted_values.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) == (undefined8 *)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)CONCAT44(sorted_values.
                                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)sorted_values.
                                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2cb,pcVar16);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_110 != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&sorted_values.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish);
  btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
  ::clear((btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
           *)&random_values);
  btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
  ::clear((btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
           *)&container);
  PVar3 = allocator1;
  PVar2 = allocator2;
  container.
  super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  .tree_.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .tree_.root_.
  super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
        )btree<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
         ::EmptyNode()::empty_node;
  container.
  super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  .tree_.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .tree_.rightmost_ =
       (node_type *)
       allocator1.
       super_CountingAllocator<phmap::btree_map<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>_>_>
       .bytes_used_;
  container.
  super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  .tree_.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .tree_.size_ = (size_type)
                 btree<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
                 ::EmptyNode()::empty_node;
  container.
  super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  .const_tree_ = (btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                  *)0x0;
  random_values.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)btree<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
                ::EmptyNode()::empty_node;
  random_values.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)allocator2.
                super_CountingAllocator<phmap::btree_map<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>_>_>
                .bytes_used_;
  random_values.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)btree<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
                ::EmptyNode()::empty_node;
  original_bytes1 = bytes1;
  local_110 = Generator<std::pair<const_int,_int>_>::operator()(&generator,0);
  btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>_>
  ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_bool>
            *)&sorted_values,
           (btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>_>
            *)&container,&local_110);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)&sorted_values,"bytes1","original_bytes1",&bytes1,&original_bytes1);
  if ((char)sorted_values.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&local_110);
    if ((undefined8 *)
        CONCAT44(sorted_values.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish._4_4_,
                 (int)sorted_values.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) == (undefined8 *)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)CONCAT44(sorted_values.
                                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)sorted_values.
                                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2d5,pcVar16);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_110 != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&sorted_values.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish);
  btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
  ::clear((btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
           *)&container);
  random_values.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)container.
                super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
                .tree_.
                super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                .
                super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                .tree_.size_;
  random_values.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)container.
                super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
                .tree_.
                super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                .
                super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                .tree_.rightmost_;
  random_values.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)container.
                super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
                .tree_.
                super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                .
                super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                .tree_.root_;
  container.
  super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  .tree_.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .tree_.rightmost_ =
       (node_type *)
       PVar2.
       super_CountingAllocator<phmap::btree_map<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>_>_>
       .bytes_used_;
  container.
  super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  .tree_.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .tree_.root_.
  super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
        )btree<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
         ::EmptyNode()::empty_node;
  container.
  super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  .tree_.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .tree_.size_ = (size_type)
                 btree<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
                 ::EmptyNode()::empty_node;
  container.
  super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  .const_tree_ = (btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                  *)0x0;
  local_110.first = 0;
  local_110.second = 0;
  local_108.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&sorted_values,"b1.size()","0",(unsigned_long *)&local_110,
             (int *)&local_108);
  if ((char)sorted_values.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&local_110);
    if ((undefined8 *)
        CONCAT44(sorted_values.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish._4_4_,
                 (int)sorted_values.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) == (undefined8 *)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)CONCAT44(sorted_values.
                                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)sorted_values.
                                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2d9,pcVar16);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_110 != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&sorted_values.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&sorted_values,"bytes1","original_bytes1",&bytes1,&original_bytes1);
  if ((char)sorted_values.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&local_110);
    if ((undefined8 *)
        CONCAT44(sorted_values.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish._4_4_,
                 (int)sorted_values.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) == (undefined8 *)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)CONCAT44(sorted_values.
                                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)sorted_values.
                                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2da,pcVar16);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_110 != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&sorted_values.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish);
  for (iVar15 = 1; iVar15 != 1000; iVar15 = iVar15 + 1) {
    local_110 = Generator<std::pair<const_int,_int>_>::operator()(&generator,iVar15);
    btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>_>
    ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_bool>
              *)&sorted_values,
             (btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>_>
              *)&container,&local_110);
  }
  testing::internal::CmpHelperGT<long,long>
            ((internal *)&sorted_values,"bytes2","bytes1",&bytes2,&bytes1);
  if ((char)sorted_values.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&local_110);
    if ((undefined8 *)
        CONCAT44(sorted_values.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish._4_4_,
                 (int)sorted_values.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) == (undefined8 *)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)CONCAT44(sorted_values.
                                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)sorted_values.
                                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2e1,pcVar16);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_110 != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&sorted_values.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish);
  btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
  ::clear((btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
           *)&random_values);
  btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
  ::clear((btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
           *)&container);
  container.
  super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  .tree_.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .tree_.root_.
  super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
        )btree<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
         ::EmptyNode()::empty_node;
  container.
  super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  .tree_.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .tree_.rightmost_ =
       (node_type *)
       PVar3.
       super_CountingAllocator<phmap::btree_map<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>_>_>
       .bytes_used_;
  container.
  super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  .tree_.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .tree_.size_ = (size_type)
                 btree<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
                 ::EmptyNode()::empty_node;
  container.
  super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  .const_tree_ = (btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                  *)0x0;
  random_values.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)btree<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
                ::EmptyNode()::empty_node;
  random_values.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)PVar2.
                super_CountingAllocator<phmap::btree_map<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>_>_>
                .bytes_used_;
  random_values.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)btree<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
                ::EmptyNode()::empty_node;
  original_bytes1 = bytes1;
  local_110 = Generator<std::pair<const_int,_int>_>::operator()(&generator,0);
  btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>_>
  ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_bool>
            *)&sorted_values,
           (btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>_>
            *)&container,&local_110);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)&sorted_values,"bytes1","original_bytes1",&bytes1,&original_bytes1);
  if ((char)sorted_values.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&local_110);
    if ((undefined8 *)
        CONCAT44(sorted_values.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish._4_4_,
                 (int)sorted_values.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) == (undefined8 *)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)CONCAT44(sorted_values.
                                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)sorted_values.
                                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2eb,pcVar16);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_110 != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&sorted_values.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish);
  pbVar1 = container.
           super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
           .const_tree_;
  random_values.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)container.
                super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
                .tree_.
                super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                .
                super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                .tree_.size_;
  random_values.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)container.
                super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
                .tree_.
                super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                .
                super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                .tree_.rightmost_;
  random_values.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)container.
                super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
                .tree_.
                super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                .
                super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                .tree_.root_;
  container.
  super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  .tree_.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .tree_.rightmost_ =
       (node_type *)
       PVar2.
       super_CountingAllocator<phmap::btree_map<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>_>_>
       .bytes_used_;
  container.
  super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  .tree_.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .tree_.root_.
  super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
        )btree<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
         ::EmptyNode()::empty_node;
  container.
  super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  .tree_.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .tree_.size_ = (size_type)
                 btree<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
                 ::EmptyNode()::empty_node;
  container.
  super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  .const_tree_ = (btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                  *)0x0;
  local_110.first = 0;
  local_110.second = 0;
  local_108.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&sorted_values,"b1.size()","0",(unsigned_long *)&local_110,
             (int *)&local_108);
  if ((char)sorted_values.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&local_110);
    if ((undefined8 *)
        CONCAT44(sorted_values.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish._4_4_,
                 (int)sorted_values.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) == (undefined8 *)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)CONCAT44(sorted_values.
                                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)sorted_values.
                                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2ef,pcVar16);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_110 != (value_type)0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&sorted_values.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish);
  local_110 = (value_type)pbVar1;
  local_108.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&sorted_values,"b2.size()","1",(unsigned_long *)&local_110,
             (int *)&local_108);
  if ((char)sorted_values.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&local_110);
    if ((undefined8 *)
        CONCAT44(sorted_values.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish._4_4_,
                 (int)sorted_values.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) == (undefined8 *)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)CONCAT44(sorted_values.
                                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)sorted_values.
                                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2f0,pcVar16);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_110 != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&sorted_values.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)&sorted_values,"bytes1","original_bytes1",&bytes1,&original_bytes1);
  if ((char)sorted_values.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&local_110);
    if ((undefined8 *)
        CONCAT44(sorted_values.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish._4_4_,
                 (int)sorted_values.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) == (undefined8 *)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)CONCAT44(sorted_values.
                                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)sorted_values.
                                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2f1,pcVar16);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_110 != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&sorted_values.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish);
  for (iVar15 = 1; iVar15 != 1000; iVar15 = iVar15 + 1) {
    local_110 = Generator<std::pair<const_int,_int>_>::operator()(&generator,iVar15);
    btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>_>
    ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>,_bool>
              *)&sorted_values,
             (btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>_>
              *)&container,&local_110);
  }
  testing::internal::CmpHelperGT<long,long>
            ((internal *)&sorted_values,"bytes2","bytes1",&bytes2,&bytes1);
  if ((char)sorted_values.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&local_110);
    if ((undefined8 *)
        CONCAT44(sorted_values.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish._4_4_,
                 (int)sorted_values.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) == (undefined8 *)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)CONCAT44(sorted_values.
                                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)sorted_values.
                                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2f8,pcVar16);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_110 != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&sorted_values.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish);
  btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
  ::clear((btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
           *)&random_values);
  btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
  ::clear((btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
           *)&container);
  CountingAllocator<phmap::btree_map<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>_>_>
  ::deallocate(&allocator1.
                super_CountingAllocator<phmap::btree_map<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>_>_>
               ,p,n);
  CountingAllocator<phmap::btree_map<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>_>_>
  ::deallocate(&allocator2.
                super_CountingAllocator<phmap::btree_map<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>_>_>
               ,p_00,n_00);
  container.
  super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  .tree_.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .tree_.root_.
  super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
        )((ulong)container.
                 super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
                 .tree_.
                 super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                 .
                 super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                 .
                 super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                 .tree_.root_.
                 super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                 .
                 super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                 .
                 super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
                 .
                 super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
                 ._M_head_impl & 0xffffffff00000000);
  Generator<int>::operator()((Generator<int> *)&container,0);
  container.
  super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  .tree_.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .tree_.root_.
  super__Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_*>
        )btree<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
         ::EmptyNode()::empty_node;
  container.
  super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  .tree_.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .tree_.rightmost_ =
       (node_type *)
       btree<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
       ::EmptyNode()::empty_node;
  container.
  super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  .tree_.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
  .tree_.size_ = 0;
  for (iVar15 = 0; iVar15 != 1000; iVar15 = iVar15 + 1) {
    sorted_values.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x3e8000003e8;
    pVar9 = Generator<std::pair<const_int,_int>_>::operator()
                      ((Generator<std::pair<const_int,_int>_> *)&sorted_values,iVar15);
    random_values.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)pVar9;
    pmVar10 = btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
              ::operator[]((btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                            *)&container,(key_type *)&random_values);
    *pmVar10 = pVar9.second;
  }
  sorted_values.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)container.
                super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
                .tree_.
                super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                .
                super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                .tree_.size_;
  bytes1 = CONCAT44(bytes1._4_4_,1000);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&random_values,"b.size()","1000",(unsigned_long *)&sorted_values,
             (int *)&bytes1);
  if ((char)random_values.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&sorted_values);
    if (random_values.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      pVar17 = (pair<int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar17 = *random_values.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&bytes1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x30e,(char *)pVar17);
    testing::internal::AssertHelper::operator=((AssertHelper *)&bytes1,(Message *)&sorted_values);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bytes1);
    if (sorted_values.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)((long)*sorted_values.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&random_values.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish);
  iVar21 = btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
           ::begin((btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                    *)&container);
  ptVar11 = btree_node<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
            ::GetField<2ul>((btree_node<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
                             *)iVar21.node);
  bytes1 = 0x3e8000003e8;
  sorted_values.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)Generator<std::pair<const_int,_int>_>::operator()
                          ((Generator<std::pair<const_int,_int>_> *)&bytes1,0);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&random_values,"b.begin()->first","Generator<value_type>(1000)(0).first",
             &ptVar11[iVar21.position].key,(int *)&sorted_values);
  if ((char)random_values.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&sorted_values);
    if (random_values.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      pVar17 = (pair<int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar17 = *random_values.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&bytes1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x313,(char *)pVar17);
    testing::internal::AssertHelper::operator=((AssertHelper *)&bytes1,(Message *)&sorted_values);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bytes1);
    if (sorted_values.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)((long)*sorted_values.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&random_values.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish);
  iVar21 = btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
           ::begin((btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                    *)&container);
  ptVar11 = btree_node<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
            ::GetField<2ul>((btree_node<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
                             *)iVar21.node);
  bytes1 = 0x3e8000003e8;
  sorted_values.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)Generator<std::pair<const_int,_int>_>::operator()
                          ((Generator<std::pair<const_int,_int>_> *)&bytes1,0);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&random_values,"b.begin()->second","Generator<value_type>(1000)(0).second",
             &(&ptVar11->value)[iVar21.position].second,
             (int *)((long)&sorted_values.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 4));
  if ((char)random_values.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&sorted_values);
    if (random_values.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      pVar17 = (pair<int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar17 = *random_values.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&bytes1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x314,(char *)pVar17);
    testing::internal::AssertHelper::operator=((AssertHelper *)&bytes1,(Message *)&sorted_values);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bytes1);
    if (sorted_values.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)((long)*sorted_values.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&random_values.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish);
  iVar21 = btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
           ::end((btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                  *)&container);
  sorted_values.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)iVar21.node;
  sorted_values.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_4_ = iVar21.position;
  ppVar12 = std::
            reverse_iterator<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>_>
            ::operator->((reverse_iterator<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>_>
                          *)&sorted_values);
  bytes2 = 0x3e8000003e8;
  bytes1 = (int64_t)Generator<std::pair<const_int,_int>_>::operator()
                              ((Generator<std::pair<const_int,_int>_> *)&bytes2,999);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&random_values,"b.rbegin()->first","Generator<value_type>(1000)(999).first"
             ,&ppVar12->first,(int *)&bytes1);
  if ((char)random_values.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&sorted_values);
    if (random_values.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      pVar17 = (pair<int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar17 = *random_values.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&bytes1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x315,(char *)pVar17);
    testing::internal::AssertHelper::operator=((AssertHelper *)&bytes1,(Message *)&sorted_values);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bytes1);
    if (sorted_values.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)((long)*sorted_values.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&random_values.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish);
  iVar21 = btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
           ::end((btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                  *)&container);
  sorted_values.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)iVar21.node;
  sorted_values.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_4_ = iVar21.position;
  ppVar12 = std::
            reverse_iterator<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>_>
            ::operator->((reverse_iterator<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>_>
                          *)&sorted_values);
  bytes2 = 0x3e8000003e8;
  bytes1 = (int64_t)Generator<std::pair<const_int,_int>_>::operator()
                              ((Generator<std::pair<const_int,_int>_> *)&bytes2,999);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&random_values,"b.rbegin()->second",
             "Generator<value_type>(1000)(999).second",&ppVar12->second,(int *)((long)&bytes1 + 4));
  if ((char)random_values.
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&sorted_values);
    if (random_values.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      pVar17 = (pair<int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar17 = *random_values.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&bytes1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x316,(char *)pVar17);
    testing::internal::AssertHelper::operator=((AssertHelper *)&bytes1,(Message *)&sorted_values);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bytes1);
    if (sorted_values.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)((long)*sorted_values.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&random_values.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish);
  btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  ::~btree((btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
            *)&container);
  return;
LAB_00130159:
  iter._8_8_ = extraout_RDX;
  iter.node = pbVar7;
  iVar20 = btree<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
           ::
           internal_last<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>,std::pair<int_const,int>&,std::pair<int_const,int>*>>
                     ((btree<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
                       *)this_00._M_head_impl,iter);
  if (iVar20.node ==
      (btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
       *)0x0) {
    iVar20 = btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
             ::end((btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                    *)&container);
  }
  btree<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
  ::internal_emplace<std::pair<int_const,int>const&>
            ((btree<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
              *)&container,iVar20,
             (pair<const_int,_int> *)
             (btree<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
              ::EmptyNode()::empty_node + 0xc));
  uVar18 = 0;
  do {
    bVar5 = btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
            ::leaf((btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                    *)this_01);
    if (bVar5) {
      uVar18 = uVar18 + 1;
      bVar4 = btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
              ::count((btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                       *)this_01);
      if ((int)(uint)bVar4 <= (int)uVar18) goto LAB_001301b7;
    }
    else {
LAB_001301b7:
      bVar5 = btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
              ::leaf((btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                      *)this_01);
      bVar4 = btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
              ::count((btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                       *)this_01);
      if (bVar5) {
        pbVar14 = (btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                   *)this_01;
        uVar13 = uVar18;
        if ((int)uVar18 < (int)(uint)bVar4) {
          __assert_fail("position >= node->count()",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0x972,
                        "void phmap::priv::btree_iterator<const phmap::priv::btree_node<phmap::priv::map_params<int, int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const int, int>>, 256, false>>, const std::pair<const int, int> &, const std::pair<const int, int> *>::increment_slow() [Node = const phmap::priv::btree_node<phmap::priv::map_params<int, int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const int, int>>, 256, false>>, Reference = const std::pair<const int, int> &, Pointer = const std::pair<const int, int> *]"
                       );
        }
        while ((bVar4 = btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                        ::count(pbVar14), uVar13 == bVar4 &&
               (bVar5 = btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                        ::is_root(pbVar14), !bVar5))) {
          pbVar7 = btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                   ::parent(pbVar14);
          bVar4 = btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                  ::position(pbVar14);
          pbVar7 = btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                   ::child(pbVar7,(ulong)bVar4);
          if (pbVar7 != pbVar14) {
            __assert_fail("node->parent()->child(node->position()) == node",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0x975,
                          "void phmap::priv::btree_iterator<const phmap::priv::btree_node<phmap::priv::map_params<int, int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const int, int>>, 256, false>>, const std::pair<const int, int> &, const std::pair<const int, int> *>::increment_slow() [Node = const phmap::priv::btree_node<phmap::priv::map_params<int, int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const int, int>>, 256, false>>, Reference = const std::pair<const int, int> &, Pointer = const std::pair<const int, int> *]"
                         );
          }
          bVar4 = btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                  ::position(pbVar14);
          uVar13 = (uint)bVar4;
          pbVar14 = btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                    ::parent(pbVar14);
        }
        bVar4 = btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                ::count(pbVar14);
        if (uVar13 != bVar4) {
          this_01 = pbVar14;
          uVar18 = uVar13;
        }
      }
      else {
        if ((int)(uint)bVar4 <= (int)uVar18) {
          __assert_fail("position < node->count()",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0x97d,
                        "void phmap::priv::btree_iterator<const phmap::priv::btree_node<phmap::priv::map_params<int, int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const int, int>>, 256, false>>, const std::pair<const int, int> &, const std::pair<const int, int> *>::increment_slow() [Node = const phmap::priv::btree_node<phmap::priv::map_params<int, int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const int, int>>, 256, false>>, Reference = const std::pair<const int, int> &, Pointer = const std::pair<const int, int> *]"
                       );
        }
        i_00 = (size_type)(int)(uVar18 + 1);
        while( true ) {
          this_01 = btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                    ::child((btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                             *)this_01,i_00);
          bVar5 = btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                  ::leaf((btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                          *)this_01);
          if (bVar5) break;
          i_00 = 0;
        }
        uVar18 = 0;
      }
    }
    cVar19 = btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
             ::end((btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                    *)&random_values);
    vVar8 = (value_type)
            container.
            super_base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
            .const_tree_;
    if (uVar18 == cVar19.position &&
        (btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
         *)this_01 == cVar19.node) goto LAB_001302d0;
    iVar20 = btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
             ::end((btree<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                    *)&container);
    psVar6 = btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
             ::slot((btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                     *)this_01,(long)(int)uVar18);
    iter_00._12_4_ = 0;
    iter_00.node = (btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
                    *)SUB128(iVar20._0_12_,0);
    iter_00.position = SUB124(iVar20._0_12_,8);
    btree<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
    ::internal_emplace<std::pair<int_const,int>const&>
              ((btree<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
                *)&container,iter_00,&psVar6->value);
  } while( true );
}

Assistant:

void BtreeTest() {
        ConstTest<T>();

        using V = typename remove_pair_const<typename T::value_type>::type;
        const std::vector<V> random_values = GenerateValuesWithSeed<V>(
            test_values, 4 * test_values,
            GTEST_FLAG_GET(random_seed));

        unique_checker<T, C> container;

        // Test key insertion/deletion in sorted order.
        std::vector<V> sorted_values(random_values);
        std::sort(sorted_values.begin(), sorted_values.end());
        DoTest("sorted:    ", &container, sorted_values);

        // Test key insertion/deletion in reverse sorted order.
        std::reverse(sorted_values.begin(), sorted_values.end());
        DoTest("rsorted:   ", &container, sorted_values);

        // Test key insertion/deletion in random order.
        DoTest("random:    ", &container, random_values);
    }